

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O2

void iod_read_fn(png_structp png_ptr,png_bytep data,png_size_t length)

{
  float fVar1;
  float fVar2;
  png_struct *ppVar3;
  png_info *ppVar4;
  QString *pQVar5;
  Representation RVar6;
  Representation RVar7;
  char cVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  Format FVar13;
  long lVar14;
  QIODevice *pQVar15;
  long lVar16;
  __jmp_buf_tag *__env;
  uchar *puVar17;
  qsizetype qVar18;
  png_byte **pppVar19;
  uchar *puVar20;
  ulong uVar21;
  QRgb c;
  byte *pbVar22;
  QSize size;
  QSize size_00;
  QSize size_01;
  QSize size_02;
  QSize size_03;
  char *image;
  byte *pbVar23;
  QPngHandlerPrivate *this;
  QSize size_04;
  QSize size_05;
  int i;
  int iVar24;
  ulong uVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  int iStack_94;
  ulong uStack_90;
  int iStack_84;
  ulong uStack_80;
  QPoint QStack_78;
  uint uStack_70;
  int iStack_6c;
  Representation RStack_68;
  Representation RStack_64;
  long lStack_60;
  png_structp ppStack_58;
  QIODevice *pQStack_50;
  long lStack_48;
  png_bytep ppStack_40;
  png_size_t pStack_38;
  
  lVar14 = png_get_io_ptr();
  pQVar15 = QImageIOHandler::device(*(QImageIOHandler **)(lVar14 + 0x78));
  if (((*(int *)(lVar14 + 0x70) == 2) &&
      (cVar8 = (**(code **)(*(long *)pQVar15 + 0x60))(pQVar15), cVar8 == '\0')) &&
     (lVar16 = (**(code **)(*(long *)pQVar15 + 0x80))(pQVar15), 0 < lVar16)) {
    lVar14 = (**(code **)(*(long *)pQVar15 + 0x80))(pQVar15);
    lVar16 = (**(code **)(*(long *)pQVar15 + 0x78))(pQVar15);
    if ((length == 4) && (lVar14 = lVar14 - lVar16, lVar14 < 4)) {
      data[0] = 0xae;
      data[1] = 'B';
      data[2] = '`';
      data[3] = 0x82;
      auVar26 = (**(code **)(*(long *)pQVar15 + 0x80))(pQVar15);
      (**(code **)(*(long *)pQVar15 + 0x88))
                (pQVar15,auVar26._0_8_,auVar26._8_8_,*(code **)(*(long *)pQVar15 + 0x88));
      return;
    }
  }
  while( true ) {
    if (length == 0) {
      return;
    }
    uVar10 = QIODevice::read((char *)pQVar15,(longlong)data);
    if ((int)uVar10 < 1) break;
    length = length - (uVar10 & 0x7fffffff);
  }
  image = "Read Error";
  this = (QPngHandlerPrivate *)png_ptr;
  png_error();
  lStack_60 = *(long *)(in_FS_OFFSET + 0x28);
  ppStack_58 = png_ptr;
  pQStack_50 = pQVar15;
  lStack_48 = lVar14;
  ppStack_40 = data;
  pStack_38 = length;
  if (this->state == Error) goto LAB_005139bd;
  if ((this->state != Ready) || (bVar9 = QPngHandlerPrivate::readPngHeader(this), bVar9)) {
    this->row_pointers = (png_byte **)0x0;
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(this->png_ptr,__longjmp_chk,200);
    iVar11 = _setjmp(__env);
    if (iVar11 == 0) {
      fVar1 = this->gamma;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        fVar2 = this->fileGamma;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          png_set_gamma(SUB84((double)(1.0 / fVar1),0),(double)fVar2,this->png_ptr);
          QColorSpace::setTransferFunction(&this->colorSpace,Gamma,1.0 / this->gamma);
          this->colorSpaceState = GammaChrm;
        }
      }
      ppVar3 = this->png_ptr;
      ppVar4 = this->info_ptr;
      RStack_64.m_i = 0;
      RStack_68.m_i = 0;
      iStack_6c = 0;
      uStack_70 = 0;
      QStack_78.xp.m_i = 0;
      QStack_78.yp.m_i = 0;
      uStack_80 = 0;
      iStack_84 = -0x55555556;
      uStack_90 = 0;
      iStack_94 = -0x55555556;
      png_get_IHDR(ppVar3,ppVar4,&RStack_64,&RStack_68,&iStack_6c,&uStack_70,0,0,0);
      RVar7.m_i = RStack_64.m_i;
      RVar6.m_i = RStack_68.m_i;
      png_set_interlace_handling(ppVar3);
      if (uStack_70 == 3) {
        iVar11 = png_get_PLTE(ppVar3,ppVar4,&uStack_90,&iStack_94);
        if ((iVar11 == 0) || (0x100 < iStack_94)) goto LAB_0051356a;
        if (iStack_6c != 1) {
          png_set_packing(ppVar3);
        }
        png_read_update_info(ppVar3,ppVar4);
        png_get_IHDR(ppVar3,ppVar4,&RStack_64,&RStack_68,&iStack_6c,&uStack_70,0,0,0);
        iVar11 = iStack_6c;
        size_04.ht.m_i = RStack_68.m_i;
        size_04.wd.m_i = RStack_64.m_i;
        bVar9 = QImageIOHandler::allocateImage
                          (size_04,(uint)(iStack_6c != 1) * 2 + Format_Mono,(QImage *)image);
        if (bVar9) {
          png_get_PLTE(ppVar3,ppVar4,&uStack_90,&iStack_94);
          iVar12 = iStack_94;
          if (iVar11 == 1) {
            iVar12 = 2;
          }
          QImage::setColorCount((QImage *)image,iVar12);
          iVar11 = png_get_tRNS(ppVar3,ppVar4,&QStack_78,&iStack_84,&uStack_80);
          lVar14 = 0;
          if ((iVar11 != 0) && (QStack_78 != (QPoint)0x0)) {
            lVar16 = 2;
            for (lVar14 = 0; lVar14 < iStack_84; lVar14 = lVar14 + 1) {
              QImage::setColor((QImage *)image,(int)lVar14,
                               (uint)*(byte *)((uStack_90 - 1) + lVar16) << 8 |
                               (uint)*(byte *)((uStack_90 - 2) + lVar16) << 0x10 |
                               (uint)*(byte *)(uStack_90 + lVar16) |
                               (uint)*(byte *)((long)QStack_78 + lVar14) << 0x18);
              lVar16 = lVar16 + 3;
            }
          }
          lVar16 = lVar14 * 3 + 2;
          for (; lVar14 < iStack_94; lVar14 = lVar14 + 1) {
            QImage::setColor((QImage *)image,(int)lVar14,
                             (uint)*(byte *)((uStack_90 - 1) + lVar16) << 8 |
                             (uint)*(byte *)((uStack_90 - 2) + lVar16) << 0x10 |
                             (uint)*(byte *)(uStack_90 + lVar16) | 0xff000000);
            lVar16 = lVar16 + 3;
          }
          png_set_bgr(ppVar3);
          goto LAB_005139f5;
        }
      }
      else if (uStack_70 == 0) {
        if ((iStack_6c == 1) && (cVar8 = png_get_channels(ppVar3,ppVar4), cVar8 == '\x01')) {
          png_set_invert_mono(ppVar3);
          png_read_update_info(ppVar3,ppVar4);
          size.ht.m_i = RVar6.m_i;
          size.wd.m_i = RVar7.m_i;
          bVar9 = QImageIOHandler::allocateImage(size,Format_Mono,(QImage *)image);
          if (!bVar9) goto LAB_0051399c;
          QImage::setColorCount((QImage *)image,2);
          QImage::setColor((QImage *)image,1,0xff000000);
          QImage::setColor((QImage *)image,0,0xffffffff);
          iVar11 = png_get_tRNS(ppVar3,ppVar4,&QStack_78,&iStack_84,&uStack_80);
          if (uStack_80 != 0 && iVar11 != 0) {
            if (*(short *)(uStack_80 + 8) == 1) {
              uVar10 = 0;
              c = 0xffffff;
            }
            else {
              if (*(short *)(uStack_80 + 8) != 0) goto LAB_005139f5;
              uVar10 = 1;
LAB_0051380d:
              c = 0;
            }
            QImage::setColor((QImage *)image,uVar10,c);
          }
LAB_005139f5:
          uStack_80 = uStack_80 & 0xffffffff00000000;
          uStack_90 = uStack_90 & 0xffffffff00000000;
          RStack_64.m_i = 0;
          RStack_68.m_i = 0;
          iStack_6c = 0;
          uStack_70 = 0;
          iStack_84 = 0;
          png_get_IHDR(this->png_ptr,this->info_ptr,&uStack_80,&uStack_90,&iStack_6c,&uStack_70,0,0,
                       0);
          png_get_oFFs(this->png_ptr,this->info_ptr,&RStack_64,&RStack_68,&iStack_84);
          puVar17 = QImage::bits((QImage *)image);
          qVar18 = QImage::bytesPerLine((QImage *)image);
          uVar25 = uStack_90 & 0xffffffff;
          pppVar19 = (png_byte **)operator_new__(uVar25 * 8);
          this->row_pointers = pppVar19;
          puVar20 = puVar17;
          for (uVar21 = 0; uVar25 != uVar21; uVar21 = uVar21 + 1) {
            this->row_pointers[uVar21] = puVar20;
            puVar20 = puVar20 + qVar18;
          }
          png_read_image(this->png_ptr,this->row_pointers);
          iVar11 = png_get_x_pixels_per_meter(this->png_ptr,this->info_ptr);
          QImage::setDotsPerMeterX((QImage *)image,iVar11);
          iVar11 = png_get_y_pixels_per_meter(this->png_ptr,this->info_ptr);
          QImage::setDotsPerMeterY((QImage *)image,iVar11);
          if (iStack_84 == 0) {
            QStack_78.yp.m_i = RStack_68.m_i;
            QStack_78.xp.m_i = RStack_64.m_i;
            QImage::setOffset((QImage *)image,&QStack_78);
          }
          if ((uStack_70 == 3) &&
             (FVar13 = QImage::format((QImage *)image), FVar13 == Format_Indexed8)) {
            iVar11 = QImage::colorCount((QImage *)image);
            for (lVar14 = 0; lVar14 < (int)uStack_90; lVar14 = lVar14 + 1) {
              pbVar23 = puVar17 + qVar18 * lVar14;
              pbVar22 = pbVar23 + (uStack_80 & 0xffffffff);
              for (; pbVar23 < pbVar22; pbVar23 = pbVar23 + 1) {
                if (iVar11 <= (int)(uint)*pbVar23) {
                  *pbVar23 = 0;
                }
              }
            }
          }
          this->state = ReadingEnd;
          png_read_end(this->png_ptr,this->end_info);
          QPngHandlerPrivate::readPngTexts(this,this->end_info);
          lVar14 = 0x18;
          for (lVar16 = 0; lVar16 < (this->readTexts).d.size + -1; lVar16 = lVar16 + 2) {
            pQVar5 = (this->readTexts).d.ptr;
            QImage::setText((QImage *)image,(QString *)((long)&pQVar5[-1].d.d + lVar14),
                            (QString *)((long)&(pQVar5->d).d + lVar14));
            lVar14 = lVar14 + 0x30;
          }
          png_destroy_read_struct(&this->png_ptr,&this->info_ptr,&this->end_info);
          this->png_ptr = (png_struct *)0x0;
          if (this->row_pointers != (png_byte **)0x0) {
            operator_delete__(this->row_pointers);
          }
          this->row_pointers = (png_byte **)0x0;
          this->state = Ready;
          if (0 < (int)this->colorSpaceState) {
            bVar9 = QColorSpace::isValid(&this->colorSpace);
            if (bVar9) {
              QImage::setColorSpace((QImage *)image,&this->colorSpace);
            }
          }
          goto LAB_005139bd;
        }
        if ((iStack_6c != 0x10) ||
           ((cVar8 = png_get_channels(ppVar3,ppVar4), cVar8 != '\x01' ||
            (iVar11 = png_get_valid(ppVar3,ppVar4,0x10), iVar11 != 0)))) {
          if (iStack_6c != 8) {
            if (iStack_6c != 0x10) {
LAB_00513706:
              if (iStack_6c < 8) {
                png_set_packing(ppVar3);
              }
              iVar11 = 0x100;
              if (iStack_6c < 8) {
                iVar11 = 1 << ((byte)iStack_6c & 0x1f);
              }
              png_read_update_info(ppVar3,ppVar4);
              size_02.ht.m_i = RVar6.m_i;
              size_02.wd.m_i = RVar7.m_i;
              bVar9 = QImageIOHandler::allocateImage(size_02,Format_Indexed8,(QImage *)image);
              if (!bVar9) goto LAB_0051399c;
              QImage::setColorCount((QImage *)image,iVar11);
              iVar24 = 0;
              i = 0;
              iVar12 = 0;
              if (0 < iVar11) {
                iVar12 = iVar11;
              }
              for (; iVar12 != i; i = i + 1) {
                uVar10 = iVar24 / (iVar11 + -1);
                QImage::setColor((QImage *)image,i,
                                 (uVar10 & 0xff) << 8 | uVar10 << 0x10 | uVar10 & 0xff | 0xff000000)
                ;
                iVar24 = iVar24 + 0xff;
              }
              iVar12 = png_get_tRNS(ppVar3,ppVar4,&QStack_78,&iStack_84,&uStack_80);
              if ((iVar12 != 0 && uStack_80 != 0) &&
                 (uVar10 = (uint)*(ushort *)(uStack_80 + 8),
                 (int)(uint)*(ushort *)(uStack_80 + 8) < iVar11)) goto LAB_0051380d;
              goto LAB_005139f5;
            }
            iVar11 = png_get_valid(ppVar3,ppVar4,0x10);
            if (iVar11 == 0) {
              FVar13 = Format_RGBX64;
              png_set_filler(ppVar3,0xffff,1);
            }
            else {
              FVar13 = Format_RGBA64;
              png_set_expand(ppVar3);
            }
            png_set_gray_to_rgb(ppVar3);
            goto LAB_0051396d;
          }
          iVar11 = png_get_valid(ppVar3,ppVar4,0x10);
          if (iVar11 != 0) goto LAB_00513706;
          png_set_expand(ppVar3);
          size_03.ht.m_i = RVar6.m_i;
          size_03.wd.m_i = RVar7.m_i;
          bVar9 = QImageIOHandler::allocateImage(size_03,Format_Grayscale8,(QImage *)image);
          if (!bVar9) goto LAB_0051399c;
          goto LAB_00513675;
        }
        FVar13 = Format_Grayscale16;
LAB_0051396d:
        size_05.ht.m_i = RVar6.m_i;
        size_05.wd.m_i = RVar7.m_i;
        bVar9 = QImageIOHandler::allocateImage(size_05,FVar13,(QImage *)image);
        if (bVar9) goto LAB_00513979;
      }
      else {
LAB_0051356a:
        if (iStack_6c == 0x10) {
          if ((uStack_70 & 1) == 0) {
            FVar13 = Format_RGBA64;
            if (((uStack_70 & 4) == 0) && (iVar11 = png_get_valid(ppVar3,ppVar4,0x10), iVar11 == 0))
            {
              png_set_filler(ppVar3,0xffff,1);
              FVar13 = Format_RGBX64;
            }
            if ((uStack_70 & 2) == 0) {
              png_set_gray_to_rgb(ppVar3);
            }
            size_00.ht.m_i = RVar6.m_i;
            size_00.wd.m_i = RVar7.m_i;
            bVar9 = QImageIOHandler::allocateImage(size_00,FVar13,(QImage *)image);
            if (!bVar9) goto LAB_0051399c;
LAB_00513979:
            png_read_update_info(ppVar3,ppVar4);
            png_set_swap(ppVar3);
            goto LAB_005139f5;
          }
          png_set_strip_16(ppVar3);
        }
        png_set_expand(ppVar3);
        if (uStack_70 == 4) {
          png_set_gray_to_rgb(ppVar3);
        }
        FVar13 = Format_ARGB32;
        if (((uStack_70 & 4) == 0) && (iVar11 = png_get_valid(ppVar3,ppVar4,0x10), iVar11 == 0)) {
          png_set_filler(ppVar3,0xff,1);
          FVar13 = Format_RGB32;
        }
        size_01.ht.m_i = RVar6.m_i;
        size_01.wd.m_i = RVar7.m_i;
        bVar9 = QImageIOHandler::allocateImage(size_01,FVar13,(QImage *)image);
        if (bVar9) {
          png_set_bgr(ppVar3);
LAB_00513675:
          png_read_update_info(ppVar3,ppVar4);
          goto LAB_005139f5;
        }
      }
    }
LAB_0051399c:
    png_destroy_read_struct(&this->png_ptr,&this->info_ptr,&this->end_info);
    this->png_ptr = (png_struct *)0x0;
    if (this->row_pointers != (png_byte **)0x0) {
      operator_delete__(this->row_pointers);
    }
  }
  this->state = Error;
LAB_005139bd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_60) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static
void iod_read_fn(png_structp png_ptr, png_bytep data, png_size_t length)
{
    QPngHandlerPrivate *d = (QPngHandlerPrivate *)png_get_io_ptr(png_ptr);
    QIODevice *in = d->q->device();

    if (d->state == QPngHandlerPrivate::ReadingEnd && !in->isSequential() && in->size() > 0 && (in->size() - in->pos()) < 4 && length == 4) {
        // Workaround for certain malformed PNGs that lack the final crc bytes
        uchar endcrc[4] = { 0xae, 0x42, 0x60, 0x82 };
        memcpy(data, endcrc, 4);
        in->seek(in->size());
        return;
    }

    while (length) {
        int nr = in->read((char*)data, length);
        if (nr <= 0) {
            png_error(png_ptr, "Read Error");
            return;
        }
        length -= nr;
    }
}